

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void anon_unknown.dwarf_9fd58::FinalizeAlignment(TypeStruct *type)

{
  longlong *plVar1;
  uint uVar2;
  long lVar3;
  MemberHandle *pMVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  for (pMVar4 = (type->members).head; pMVar4 != (MemberHandle *)0x0; pMVar4 = pMVar4->next) {
    uVar2 = pMVar4->variable->alignment;
    if (uVar2 < uVar6) {
      uVar2 = uVar6;
    }
    uVar6 = uVar2;
    if (pMVar4->variable->type->hasPointers == true) {
      (type->super_TypeBase).hasPointers = true;
    }
  }
  if ((type->super_TypeBase).alignment == 0) {
    (type->super_TypeBase).alignment = uVar6;
  }
  uVar6 = (type->super_TypeBase).alignment;
  uVar7 = 4;
  if (4 < uVar6) {
    uVar7 = (ulong)uVar6;
  }
  lVar3 = (type->super_TypeBase).size;
  lVar5 = lVar3 % (long)uVar7;
  if (lVar5 != 0) {
    uVar6 = (int)uVar7 - (int)lVar5;
    (type->super_TypeBase).padding = uVar6;
    (type->super_TypeBase).size = lVar3 + (ulong)uVar6;
    plVar1 = &type->typeScope->dataSize;
    *plVar1 = *plVar1 + (ulong)uVar6;
  }
  return;
}

Assistant:

void FinalizeAlignment(TypeStruct *type)
	{
		unsigned maximumAlignment = 0;

		// Additional padding may apply to preserve the alignment of members
		for(MemberHandle *curr = type->members.head; curr; curr = curr->next)
		{
			maximumAlignment = maximumAlignment > curr->variable->alignment ? maximumAlignment : curr->variable->alignment;

			if(curr->variable->type->hasPointers)
				type->hasPointers = true;
		}

		// If explicit alignment is not specified, then class must be aligned to the maximum alignment of the members
		if(type->alignment == 0)
			type->alignment = maximumAlignment;

		// In NULLC, all classes have sizes multiple of 4, so add additional padding if necessary
		maximumAlignment = type->alignment < 4 ? 4 : type->alignment;

		if(type->size % maximumAlignment != 0)
		{
			type->padding = maximumAlignment - (type->size % maximumAlignment);

			type->size += type->padding;
			type->typeScope->dataSize += type->padding;
		}
	}